

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::ApiCase::expectEitherError(ApiCase *this,EGLenum expectedA,EGLenum expectedB)

{
  ostringstream *this_00;
  TestContext *this_01;
  Library *pLVar1;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1e0.m_value = (*pLVar1->_vptr_Library[0x1f])(pLVar1);
  if (local_1e0.m_value != expectedB && local_1e0.m_value != expectedA) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"// ERROR expected: ");
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = expectedA;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," or ");
    local_1d0.m_getName = eglu::getErrorName;
    local_1d0.m_value = expectedB;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", Got: ");
    local_1e0.m_getName = eglu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid error");
    }
  }
  return;
}

Assistant:

void ApiCase::expectEitherError (EGLenum expectedA, EGLenum expectedB)
{
	EGLenum err = m_eglTestCtx.getLibrary().getError();
	if (err != expectedA && err != expectedB)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: " << eglu::getErrorStr(expectedA) << " or " << eglu::getErrorStr(expectedB) << ", Got: " << eglu::getErrorStr(err) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}